

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

void __thiscall cmVirtualDirectoryWatcher::StartWatching(cmVirtualDirectoryWatcher *this)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->Children)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    (*(code *)(p_Var1[5]._M_nxt)->_M_nxt[5]._M_nxt)();
  }
  return;
}

Assistant:

void StartWatching() override
  {
    for (const auto& i : this->Children) {
      i.second->StartWatching();
    }
  }